

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_vtk.cpp
# Opt level: O0

void Omega_h::vtk::write_vtkfile_vtu_start_tag(ostream *stream,bool compress)

{
  bool bVar1;
  char *pcVar2;
  bool compress_local;
  ostream *stream_local;
  
  std::operator<<(stream,"<VTKFile type=\"UnstructuredGrid\" byte_order=\"");
  bVar1 = is_little_endian_cpu();
  if (bVar1) {
    std::operator<<(stream,"LittleEndian");
  }
  else {
    std::operator<<(stream,"BigEndian");
  }
  std::operator<<(stream,"\" header_type=\"");
  pcVar2 = Traits<unsigned_long,_void>::name();
  std::operator<<(stream,pcVar2);
  std::operator<<(stream,"\"");
  if (compress) {
    std::operator<<(stream," compressor=\"vtkZLibDataCompressor\"");
  }
  std::operator<<(stream,">\n");
  return;
}

Assistant:

void write_vtkfile_vtu_start_tag(std::ostream& stream, bool compress) {
  stream << "<VTKFile type=\"UnstructuredGrid\" byte_order=\"";
  if (is_little_endian_cpu())
    stream << "LittleEndian";
  else
    stream << "BigEndian";
  stream << "\" header_type=\"";
  stream << Traits<std::uint64_t>::name();
  stream << "\"";
#ifdef OMEGA_H_USE_ZLIB
  if (compress) {
    stream << " compressor=\"vtkZLibDataCompressor\"";
  }
#else
  OMEGA_H_CHECK(!compress);
#endif
  stream << ">\n";
}